

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.cc
# Opt level: O0

void __thiscall
AGC::work(AGC *this,
         shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
         *qin,shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
              *qout)

{
  bool bVar1;
  element_type *peVar2;
  pointer this_00;
  AGC *this_01;
  complex<float> *nsamples_00;
  complex<float> *ci_00;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *in_RDX;
  int __fd;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *in_RDI;
  SamplePublisher *unaff_retaddr;
  complex<float> *co;
  complex<float> *ci;
  size_type nsamples;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  output;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  input;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  *in_stack_ffffffffffffff68;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  *in_stack_ffffffffffffff70;
  type in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *in_stack_ffffffffffffff90;
  _Head_base<0UL,_std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_*,_false>
  in_stack_ffffffffffffffa0;
  complex<float> *in_stack_ffffffffffffffa8;
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *samples;
  
  samples = in_RDI;
  peVar2 = std::
           __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b71f9);
  __fd = (int)peVar2;
  Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForRead
            (in_RDI);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                      *)0x1b7210);
  if (bVar1) {
    std::
    __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b7258);
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::popForWrite
              (in_RDX);
    this_00 = std::
              unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
              ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                            *)0x1b7271);
    this_01 = (AGC *)std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::size
                               (this_00);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)0x1b7288);
    std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::resize
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)0x1b72a1);
    nsamples_00 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::data
                            ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                             0x1b72a9);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::operator->((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)0x1b72b8);
    ci_00 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::data
                      ((vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *)
                       0x1b72c0);
    work(this_01,(size_t)nsamples_00,ci_00,in_stack_ffffffffffffffa8);
    std::
    __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1b72ed);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::unique_ptr(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushRead
              ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
               in_stack_ffffffffffffffa0._M_head_impl,
               (unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                *)in_RDI);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *)in_stack_ffffffffffffff80);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *)
                       0x1b732f);
    if (bVar1) {
      std::unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_>::operator->
                ((unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> *)0x1b7343);
      in_stack_ffffffffffffff80 =
           std::
           unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
           ::operator*(in_stack_ffffffffffffff70);
      SamplePublisher::publish(unaff_retaddr,(Samples *)samples);
    }
    peVar2 = std::
             __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b73a6);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)&stack0xffffffffffffffa0,
                 (unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                  *)peVar2);
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::pushWrite
              ((Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *)in_stack_ffffffffffffff80);
    std::
    unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                   *)in_stack_ffffffffffffff80);
  }
  else {
    peVar2 = std::
             __shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b7221);
    Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>::close
              (peVar2,__fd);
  }
  std::
  unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>,_std::default_delete<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
                 *)in_stack_ffffffffffffff80);
  return;
}

Assistant:

void AGC::work(
    const std::shared_ptr<Queue<Samples> >& qin,
    const std::shared_ptr<Queue<Samples> >& qout) {
  auto input = qin->popForRead();
  if (!input) {
    qout->close();
    return;
  }

  auto output = qout->popForWrite();
  auto nsamples = input->size();
  output->resize(nsamples);

  // Do actual work
  auto ci = input->data();
  auto co = output->data();
  work(nsamples, ci, co);

  // Return input buffer
  qin->pushRead(std::move(input));

  // Publish output if applicable
  if (samplePublisher_) {
    samplePublisher_->publish(*output);
  }

  // Return output buffer
  qout->pushWrite(std::move(output));
}